

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

Node * __thiscall Assimp::ColladaLoader::FindNodeBySID(ColladaLoader *this,Node *pNode,string *pSID)

{
  __type _Var1;
  Node *pNVar2;
  const_reference ppNVar3;
  Node *node;
  size_t a;
  string *pSID_local;
  Node *pNode_local;
  ColladaLoader *this_local;
  
  if (pNode == (Node *)0x0) {
    this_local = (ColladaLoader *)0x0;
  }
  else {
    _Var1 = std::operator==(&pNode->mSID,pSID);
    this_local = (ColladaLoader *)pNode;
    if (!_Var1) {
      for (node = (Node *)0x0;
          pNVar2 = (Node *)std::
                           vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                           ::size(&pNode->mChildren), node < pNVar2;
          node = (Node *)&(node->mName).field_0x1) {
        ppNVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
                  operator[](&pNode->mChildren,(size_type)node);
        pNVar2 = FindNodeBySID(this,*ppNVar3,pSID);
        if (pNVar2 != (Node *)0x0) {
          return pNVar2;
        }
      }
      this_local = (ColladaLoader *)0x0;
    }
  }
  return (Node *)this_local;
}

Assistant:

const Collada::Node* ColladaLoader::FindNodeBySID( const Collada::Node* pNode, const std::string& pSID) const {
    if (nullptr == pNode) {
        return nullptr;
    }

    if (pNode->mSID == pSID) {
        return pNode;
    }

    for( size_t a = 0; a < pNode->mChildren.size(); ++a) {
        const Collada::Node* node = FindNodeBySID( pNode->mChildren[a], pSID);
        if (node) {
            return node;
        }
    }

    return nullptr;
}